

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  GreetingAdapterClassStyle *this;
  ColorPrinter *this_00;
  GreetingAdapterCompositeStyle *this_01;
  
  this = (GreetingAdapterClassStyle *)operator_new(0x20);
  GreetingAdapterClassStyle::GreetingAdapterClassStyle(this);
  GreetingAdapterClassStyle::greeting(this);
  this_00 = (ColorPrinter *)operator_new(0x10);
  ColorPrinter::ColorPrinter(this_00);
  ColorPrinter::setColor(this_00,COLOR_GREEN);
  this_01 = (GreetingAdapterCompositeStyle *)operator_new(0x18);
  GreetingAdapterCompositeStyle::GreetingAdapterCompositeStyle(this_01,this_00);
  GreetingAdapterCompositeStyle::greeting(this_01);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	GreetingAdapterClassStyle *adapter1 = new GreetingAdapterClassStyle();
	adapter1->greeting();

	ColorPrinter *printer = new ColorPrinter();
	printer->setColor(COLOR_GREEN);
	GreetingAdapterCompositeStyle *adapter2 = new GreetingAdapterCompositeStyle(printer);

	adapter2->greeting();

	return 0;
}